

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConcatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  key_type *__k;
  NeuralNetworkLayer *layer_00;
  bool bVar4;
  undefined1 *puVar5;
  LogMessage *other;
  iterator iVar6;
  Type *__k_00;
  mapped_type *pmVar7;
  long *plVar8;
  long *plVar9;
  Result *_result;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar10;
  _Rb_tree_header *p_Var11;
  long lVar12;
  string err;
  undefined1 local_108 [56];
  long local_d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_c8;
  NeuralNetworkLayer *local_c0;
  Rep *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,2,-1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar4 = Result::good(__return_storage_ptr__);
    if (bVar4) {
      pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      local_c0 = layer;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      if (this->ndArrayInterpretation == true) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Concat","");
        layer_00 = local_c0;
        pmVar10 = &this->blobNameToRank;
        validateInputOutputRankEquality(__return_storage_ptr__,local_c0,&local_50,pmVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good(__return_storage_ptr__);
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        if (layer_00->_oneof_case_[0] == 0x140) {
          puVar5 = *(undefined1 **)&layer_00->layer_;
        }
        else {
          puVar5 = Specification::_ConcatLayerParams_default_instance_;
        }
        if (((MeanVarianceNormalizeLayerParams *)puVar5)->acrosschannels_ == true) {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Concat","");
          validateRankCount(__return_storage_ptr__,layer_00,(string *)local_108,5,-1,pmVar10);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
          }
          bVar4 = Result::good(__return_storage_ptr__);
        }
        else {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Concat","");
          validateRankCount(__return_storage_ptr__,layer_00,(string *)local_108,3,-1,pmVar10);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
          }
          bVar4 = Result::good(__return_storage_ptr__);
        }
        if (bVar4 == false) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        local_c8 = pmVar10;
        if ((layer_00->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          other = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
          pmVar10 = local_c8;
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
        }
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&pmVar10->_M_t,
                       (key_type *)((layer_00->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                      );
        p_Var11 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar6._M_node != p_Var11) {
          __k_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(layer_00->input_).super_RepeatedPtrFieldBase,0);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(pmVar10,__k_00);
          pmVar10 = local_c8;
          local_b8 = (layer_00->input_).super_RepeatedPtrFieldBase.rep_;
          if (local_b8 != (Rep *)0x0) {
            local_b8 = (Rep *)local_b8->elements;
          }
          local_d0 = (long)(layer_00->input_).super_RepeatedPtrFieldBase.current_size_;
          if (local_d0 != 0) {
            iVar2 = *pmVar7;
            local_d0 = local_d0 << 3;
            lVar12 = 0;
            do {
              __k = *(key_type **)((long)local_b8->elements + lVar12 + -8);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&pmVar10->_M_t,__k);
              if (((_Rb_tree_header *)iVar6._M_node != p_Var11) &&
                 (pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at(pmVar10,__k), iVar2 != *pmVar7)) {
                local_108._8_8_ = (char *)0x0;
                local_108[0x10] = '\0';
                plVar8 = (long *)((ulong)(local_c0->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                lVar12 = *plVar8;
                local_108._0_8_ = local_108 + 0x10;
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b0,lVar12,plVar8[1] + lVar12);
                std::operator+(&local_90,"Layer \'",&local_b0);
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
                plVar9 = plVar8 + 2;
                if ((long *)*plVar8 == plVar9) {
                  local_60 = *plVar9;
                  lStack_58 = plVar8[3];
                  local_70 = &local_60;
                }
                else {
                  local_60 = *plVar9;
                  local_70 = (long *)*plVar8;
                }
                local_68 = plVar8[1];
                *plVar8 = (long)plVar9;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_108,(string *)&local_70);
                if (local_70 != &local_60) {
                  operator_delete(local_70,local_60 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,
                                  local_b0.field_2._M_allocated_capacity + 1);
                }
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
                if ((undefined1 *)local_108._0_8_ == local_108 + 0x10) {
                  return __return_storage_ptr__;
                }
                operator_delete((void *)local_108._0_8_,
                                CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
                return __return_storage_ptr__;
              }
              lVar12 = lVar12 + 8;
            } while (local_d0 != lVar12);
          }
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConcatLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Concat", blobNameToRank));

        if (layer.concat().sequenceconcat()) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Concat", 5, -1, blobNameToRank));
        } else {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Concat", 3, -1, blobNameToRank));
        }

        // check that all inputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.input(0));
        } else {
            return Result();
        }

        for (const auto& input : layer.input()) {
            if (blobNameToRank.find(input) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(input)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Concat' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}